

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irStatement *
new_ir_move(Context_conflict *ctx,MOJOSHADER_irExpression *dst,MOJOSHADER_irExpression *src,
           int writemask)

{
  MOJOSHADER_irStatement *pMVar1;
  
  pMVar1 = (MOJOSHADER_irStatement *)(*ctx->malloc)(0x30,ctx->malloc_data);
  if (pMVar1 == (MOJOSHADER_irStatement *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    (pMVar1->ir).type = MOJOSHADER_IR_MOVE;
    (pMVar1->ir).filename = ctx->sourcefile;
    (pMVar1->ir).line = ctx->sourceline;
    if (((dst == (MOJOSHADER_irExpression *)0x0) || (src == (MOJOSHADER_irExpression *)0x0)) ||
       ((dst->info).type != (src->info).type)) {
      __assert_fail("dst && src && (dst->info.type == src->info.type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x12b4,
                    "MOJOSHADER_irStatement *new_ir_move(Context *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, const int)"
                   );
    }
    if ((dst->info).elements != (src->info).elements) {
      __assert_fail("dst && src && (dst->info.elements == src->info.elements)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x12b5,
                    "MOJOSHADER_irStatement *new_ir_move(Context *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, const int)"
                   );
    }
    (pMVar1->move).dst = dst;
    (pMVar1->move).src = src;
    (pMVar1->move).writemask = -1;
  }
  return pMVar1;
}

Assistant:

static MOJOSHADER_irStatement *new_ir_move(Context *ctx,
                                      MOJOSHADER_irExpression *dst,
                                      MOJOSHADER_irExpression *src,
                                      const int writemask)
{
    NEW_IR_NODE(retval, MOJOSHADER_irMove, MOJOSHADER_IR_MOVE);
    assert(dst && src && (dst->info.type == src->info.type));
    assert(dst && src && (dst->info.elements == src->info.elements));
    retval->dst = dst;
    retval->src = src;
    retval->writemask = writemask;
    return (MOJOSHADER_irStatement *) retval;
}